

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O2

void __thiscall
vk::DebugReportRecorder::DebugReportRecorder
          (DebugReportRecorder *this,InstanceInterface *vki,VkInstance instance)

{
  Handle<(vk::HandleType)29> HVar1;
  InstanceInterface *pIVar2;
  VkInstance pVVar3;
  VkAllocationCallbacks *pVVar4;
  undefined1 local_68 [24];
  VkAllocationCallbacks *pVStack_50;
  DebugReportRecorder *local_48;
  RefBase<vk::Handle<(vk::HandleType)29>_> local_38;
  
  de::AppendList<vk::DebugReportMessage>::AppendList(&this->m_messages,0x400);
  local_68._0_4_ = VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT;
  local_68._8_8_ = (void *)0x0;
  local_68._16_4_ = 0x1f;
  pVStack_50 = (VkAllocationCallbacks *)vk::anon_unknown_0::debugReportCallback;
  local_48 = this;
  createDebugReportCallbackEXT
            ((Move<vk::Handle<(vk::HandleType)29>_> *)&local_38,vki,instance,
             (VkDebugReportCallbackCreateInfoEXT *)local_68,(VkAllocationCallbacks *)0x0);
  pVVar4 = local_38.m_data.deleter.m_allocator;
  pVVar3 = local_38.m_data.deleter.m_instance;
  pIVar2 = local_38.m_data.deleter.m_instanceIface;
  HVar1.m_internal = local_38.m_data.object.m_internal;
  local_68._16_8_ = local_38.m_data.deleter.m_instance;
  pVStack_50 = local_38.m_data.deleter.m_allocator;
  local_68._0_8_ = local_38.m_data.object.m_internal;
  local_68._8_8_ = local_38.m_data.deleter.m_instanceIface;
  local_38.m_data.object.m_internal = 0;
  local_38.m_data.deleter.m_instanceIface = (InstanceInterface *)0x0;
  local_38.m_data.deleter.m_instance = (VkInstance)0x0;
  local_38.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_instance =
       pVVar3;
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_allocator =
       pVVar4;
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.object.m_internal =
       HVar1.m_internal;
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_instanceIface =
       pIVar2;
  refdetails::RefBase<vk::Handle<(vk::HandleType)29>_>::~RefBase(&local_38);
  return;
}

Assistant:

DebugReportRecorder::DebugReportRecorder (const InstanceInterface& vki, VkInstance instance)
	: m_messages	(1024)
	, m_callback	(createCallback(vki, instance, &m_messages))
{
}